

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

long CVariableInt::Compress(void *pSrc_,int SrcSize,void *pDst_,int DstSize)

{
  uchar *puVar1;
  int in_ECX;
  uchar *in_RDX;
  int in_ESI;
  int *in_RDI;
  uchar *pDstEnd;
  uchar *pDst;
  int *pSrc;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  uchar *local_38;
  int *local_30;
  int local_14;
  
  dbg_assert_imp(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                 (char *)0x133f07);
  puVar1 = in_RDX + in_ECX;
  local_14 = (int)((ulong)(long)in_ESI >> 2);
  local_38 = in_RDX;
  local_30 = in_RDI;
  while( true ) {
    if (local_14 == 0) {
      return (long)local_38 - (long)in_RDX;
    }
    if ((long)puVar1 - (long)local_38 < 6) break;
    local_38 = Pack(local_38,*local_30);
    local_14 = local_14 + -1;
    local_30 = local_30 + 1;
  }
  return -1;
}

Assistant:

long CVariableInt::Compress(const void *pSrc_, int SrcSize, void *pDst_, int DstSize)
{
	dbg_assert(SrcSize % sizeof(int) == 0, "invalid bounds");

	const int *pSrc = (int *)pSrc_;
	unsigned char *pDst = (unsigned char *)pDst_;
	const unsigned char *pDstEnd = pDst + DstSize;
	SrcSize /= sizeof(int);
	while(SrcSize)
	{
		if(pDstEnd - pDst <= MAX_BYTES_PACKED)
			return -1;
		pDst = CVariableInt::Pack(pDst, *pSrc);
		SrcSize--;
		pSrc++;
	}
	return (long)(pDst - (unsigned char *)pDst_);
}